

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_ERROR_CODE
qpdf_write_json(qpdf_data qpdf,int version,qpdf_write_fn_t fn,void *udata,
               qpdf_stream_decode_level_e decode_level,qpdf_json_stream_data_e json_stream_data,
               char *file_prefix,char **wanted_objects)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QPDF_ERROR_CODE QVar3;
  allocator<char> local_e9;
  qpdf_stream_decode_level_e local_e8;
  qpdf_json_stream_data_e local_e4;
  qpdf_data local_e0;
  shared_ptr<Pl_Function> p;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  char *pcStack_80;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  void *udata_local;
  qpdf_write_fn_t fn_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wanted_objects_set;
  
  wanted_objects_set._M_t._M_impl._0_8_ = 0;
  local_e8 = decode_level;
  local_e4 = json_stream_data;
  local_e0 = qpdf;
  udata_local = udata;
  fn_local = fn;
  std::
  make_shared<Pl_Function,char_const(&)[11],decltype(nullptr),int(*&)(char_const*,unsigned_long,void*),void*&>
            ((char (*) [11])&p,(void **)"write_json",
             (_func_int_char_ptr_unsigned_long_void_ptr **)&wanted_objects_set,&fn_local);
  wanted_objects_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &wanted_objects_set._M_t._M_impl.super__Rb_tree_header._M_header;
  wanted_objects_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  wanted_objects_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  wanted_objects_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  wanted_objects_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       wanted_objects_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (wanted_objects != (char **)0x0) {
    for (; *wanted_objects != (char *)0x0; wanted_objects = wanted_objects + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,*wanted_objects,&local_e9);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&wanted_objects_set,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  local_a0._0_4_ = version;
  std::__shared_ptr<Pl_Function,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Pl_Function,_(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
             &p.super___shared_ptr<Pl_Function,_(__gnu_cxx::_Lock_policy)2>);
  aStack_90._8_4_ = local_e8;
  aStack_90._12_4_ = local_e4;
  pcStack_80 = file_prefix;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_78 = &wanted_objects_set;
  local_c8._M_unused._M_object = operator_new(0x30);
  uVar2 = aStack_90._M_allocated_capacity;
  uVar1 = local_a0._8_8_;
  aStack_90._M_allocated_capacity = 0;
  local_a0._8_8_ = 0;
  *(undefined4 *)local_c8._M_unused._0_8_ = local_a0._0_4_;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = uVar1;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = uVar2;
  *(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)((long)local_c8._M_unused._0_8_ + 0x28) = local_78;
  *(ulong *)((long)local_c8._M_unused._0_8_ + 0x18) = CONCAT44(aStack_90._12_4_,aStack_90._8_4_);
  *(char **)((long)local_c8._M_unused._0_8_ + 0x20) = pcStack_80;
  pcStack_b0 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1955:9)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1955:9)>
             ::_M_manager;
  QVar3 = trap_errors(local_e0,(function<void_(_qpdf_data_*)> *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_90._M_allocated_capacity);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&wanted_objects_set._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<Pl_Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return QVar3;
}

Assistant:

QPDF_ERROR_CODE
qpdf_write_json(
    qpdf_data qpdf,
    int version,
    qpdf_write_fn_t fn,
    void* udata,
    enum qpdf_stream_decode_level_e decode_level,
    enum qpdf_json_stream_data_e json_stream_data,
    char const* file_prefix,
    char const* const* wanted_objects)
{
    QPDF_ERROR_CODE status = QPDF_SUCCESS;
    auto p = std::make_shared<Pl_Function>("write_json", nullptr, fn, udata);
    std::set<std::string> wanted_objects_set;
    if (wanted_objects) {
        for (auto i = wanted_objects; *i; ++i) {
            wanted_objects_set.insert(*i);
        }
    }
    status = trap_errors(
        qpdf,
        [version, p, decode_level, json_stream_data, file_prefix, &wanted_objects_set](
            qpdf_data q) {
            q->qpdf->writeJSON(
                version, p.get(), decode_level, json_stream_data, file_prefix, wanted_objects_set);
        });
    return status;
}